

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

int abs(int __x)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar1;
  undefined4 in_register_0000003c;
  vector<Blade,_std::allocator<Blade>_> *__x_00;
  float fVar2;
  Clifford temp;
  Clifford xb;
  vector<Blade,_std::allocator<Blade>_> local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  Clifford local_90;
  Clifford local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  vector<Blade,_std::allocator<Blade>_> local_30;
  
  __x_00 = (vector<Blade,_std::allocator<Blade>_> *)CONCAT44(in_register_0000003c,__x);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_30,__x_00);
  if (local_30.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_30.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = (local_30.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_30);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,__x_00);
  for (; (local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
          ._M_finish &&
         ((ABS((local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_start)->mVal) <= 1e-06 ||
          ((local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
            super__Vector_impl_data._M_start)->mBase == 0))));
      local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  if (local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,__x_00);
    operator!(&local_78,&local_60);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a8,__x_00);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,&local_78);
    operator|(&local_90,&local_a8,&local_c0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d8,&local_90);
    abs((int)&local_d8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
    iVar1 = extraout_EAX_00;
  }
  else {
    iVar1 = extraout_EAX;
    if (ABS(fVar2) < 0.0) {
      sqrtf(ABS(fVar2));
      iVar1 = extraout_EAX_01;
    }
  }
  return iVar1;
}

Assistant:

float abs(Clifford A)
{
	float sk; sk<=A;

	if(isScalar(A))
	{
		return sqrt(fabs(sk));
	}

	Clifford xb = !A;
	Clifford temp = A|xb;
	return abs(temp);


}